

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O3

void Addr_ESI(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  UInt32 *pUVar1;
  int iVar2;
  UIntPtr UVar3;
  long lVar4;
  Int64 IVar5;
  size_t sVar6;
  ulong uVar7;
  char (*pacVar8) [8];
  
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    pMyOperand->OpMnemonic[2] = '\0';
    pMyOperand->OpMnemonic[0] = '(';
    pMyOperand->OpMnemonic[1] = '%';
    lVar4 = 2;
  }
  else {
    lVar4 = 0;
  }
  pMyOperand->OpType = 0x30000;
  iVar2 = (pMyDisasm->Reserved_).AddressSize;
  if (iVar2 == 0x20) {
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      pacVar8 = Registers32Bits + 0xe;
      goto LAB_0013d3f0;
    }
    pacVar8 = Registers32Bits + 6;
LAB_0013d458:
    strcpy(pMyOperand->OpMnemonic + lVar4,*pacVar8);
    IVar5 = REGS[6];
  }
  else {
    if (iVar2 != 0x40) {
      pUVar1 = &(pMyDisasm->Reserved_).DECALAGE_EIP;
      *pUVar1 = *pUVar1 + 2;
      UVar3 = (pMyDisasm->Reserved_).EIP_;
      uVar7 = (pMyDisasm->Reserved_).EndOfBlock;
      if (uVar7 < UVar3 + 4 && uVar7 != 0) {
        (pMyDisasm->Reserved_).OutOfBlock = 1;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
        return;
      }
      uVar7 = (ulong)*(ushort *)(UVar3 + 2);
      (pMyOperand->Memory).Displacement = uVar7;
      CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + lVar4,"%.4X",uVar7);
      goto LAB_0013d46b;
    }
    if ((pMyDisasm->Reserved_).REX.B_ != '\x01') {
      pacVar8 = (char (*) [8])(Registers64Bits + 6);
      goto LAB_0013d458;
    }
    pacVar8 = (char (*) [8])(Registers64Bits + 0xe);
LAB_0013d3f0:
    strcpy(pMyOperand->OpMnemonic + lVar4,*pacVar8);
    IVar5 = REGS[0xe];
  }
  (pMyOperand->Memory).BaseRegister = IVar5;
LAB_0013d46b:
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    sVar6 = strlen(pMyOperand->OpMnemonic);
    (pMyOperand->OpMnemonic + sVar6)[0] = ')';
    (pMyOperand->OpMnemonic + sVar6)[1] = '\0';
  }
  return;
}

Assistant:

void __bea_callspec__ Addr_ESI(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
    long MyNumber;
    size_t i = 0;
    #ifndef BEA_LIGHT_DISASSEMBLY
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic, "(%");
        i += 2;
    }
     #endif
    pMyOperand->OpType = MEMORY_TYPE;
    if (GV.AddressSize == 64) {
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers64Bits[14]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6+8];
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers64Bits[6]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6];
        }
    }
    else if (GV.AddressSize == 32) {

        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers32Bits[14]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6+8];
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyOperand->OpMnemonic+i, Registers32Bits[6]);
            #endif
            pMyOperand->Memory.BaseRegister = REGS[6];
        }
    }
    else {
        GV.DECALAGE_EIP+=2;
        if (!Security(4, pMyDisasm)) return;
        MyNumber = *((UInt16*) (GV.EIP_+2));
        pMyOperand->Memory.Displacement = MyNumber;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+i,"%.4X", (Int64)MyNumber);
        #endif
    }
    #ifndef BEA_LIGHT_DISASSEMBLY
    i = strlen ((char*) &pMyOperand->OpMnemonic);
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
        i += 1;
    }
  #endif
}